

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateCodecCode
          (WrapperFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  string_view text;
  string_view text_00;
  
  vars = &(this->super_FieldGeneratorBase).variables_;
  if (this->is_value_type == true) {
    text._M_str = "pb::FieldCodec.ForStructWrapper<$nonnullable_type_name$>($tag$)";
    text._M_len = 0x3f;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text);
    return;
  }
  text_00._M_str = "pb::FieldCodec.ForClassWrapper<$type_name$>($tag$)";
  text_00._M_len = 0x32;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateCodecCode(io::Printer* printer) {
  if (is_value_type) {
    printer->Print(
      variables_,
      "pb::FieldCodec.ForStructWrapper<$nonnullable_type_name$>($tag$)");
  } else {
    printer->Print(
      variables_,
      "pb::FieldCodec.ForClassWrapper<$type_name$>($tag$)");
  }
}